

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGenerator.cpp
# Opt level: O2

JavascriptGenerator *
Js::JavascriptGenerator::New
          (Recycler *recycler,DynamicType *generatorType,Arguments *args,
          ScriptFunction *scriptFunction)

{
  Type address;
  Recycler *pRVar1;
  WriteBarrierPtr<void> *dst;
  JavascriptGenerator *this;
  ulong dstCount;
  undefined1 local_70 [8];
  TrackAllocData data;
  Arguments heapArgs;
  
  data._32_8_ = args->Info;
  data.plusSize = data._32_8_ & 0xffffff;
  if (data.plusSize != 0) {
    local_70 = (undefined1  [8])&Memory::WriteBarrierPtr<void>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_72810ad;
    data.filename._0_4_ = 0x4e;
    pRVar1 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_70);
    dst = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<void>,false>
                    ((Memory *)pRVar1,(Recycler *)Memory::Recycler::Alloc,0,
                     (ulong)args->Info & 0xffffff);
    dstCount = (ulong)args->Info & 0xffffff;
    Memory::CopyArray<void*,Memory::WriteBarrierPtr<void>,Memory::Recycler>
              (&dst->ptr,dstCount,args->Values,dstCount);
    data._32_8_ = args->Info;
  }
  if (DAT_0145c43e == '\x01') {
    local_70 = (undefined1  [8])&typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_72810ad;
    data.filename._0_4_ = 0x5c;
    pRVar1 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_70);
    this = (JavascriptGenerator *)new<Memory::Recycler>(0x60,pRVar1,0x391482);
    JavascriptGenerator(this,generatorType,(Arguments *)&data.line,scriptFunction);
    address = (this->args).Values;
    if (address != (Type)0x0) {
      Memory::Recycler::RegisterPendingWriteBarrierBlock
                (recycler,address,(ulong)((*(uint *)&(this->args).Info & 0xffffff) << 3));
      Memory::Recycler::RegisterPendingWriteBarrierBlock(recycler,&(this->args).Values,8);
    }
  }
  else {
    local_70 = (undefined1  [8])&typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_72810ad;
    data.filename._0_4_ = 0x6d;
    pRVar1 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_70);
    this = (JavascriptGenerator *)new<Memory::Recycler>(0x60,pRVar1,0x37a1d4);
    JavascriptGenerator(this,generatorType,(Arguments *)&data.line,scriptFunction);
  }
  return this;
}

Assistant:

JavascriptGenerator* JavascriptGenerator::New(
    Recycler* recycler,
    DynamicType* generatorType,
    Arguments& args,
    ScriptFunction* scriptFunction)
{
    // InterpreterStackFrame takes a pointer to the args, so copy them to the recycler
    // heap and use that buffer for the generator's InterpreterStackFrame
    Field(Var)* argValuesCopy = nullptr;

    if (args.Info.Count > 0)
    {
        argValuesCopy = RecyclerNewArray(recycler, Field(Var), args.Info.Count);
        CopyArray(argValuesCopy, args.Info.Count, args.Values, args.Info.Count);
    }

    Arguments heapArgs(args.Info, unsafe_write_barrier_cast<Var*>(argValuesCopy));

#if GLOBAL_ENABLE_WRITE_BARRIER
    if (CONFIG_FLAG(ForceSoftwareWriteBarrier))
    {
        JavascriptGenerator* obj = RecyclerNewFinalized(
            recycler,
            JavascriptGenerator,
            generatorType,
            heapArgs,
            scriptFunction);

        if (obj->args.Values != nullptr)
        {
            recycler->RegisterPendingWriteBarrierBlock(
                obj->args.Values,
                obj->args.Info.Count * sizeof(Var));

            recycler->RegisterPendingWriteBarrierBlock(
                &obj->args.Values,
                sizeof(Var*));
        }

        return obj;
    }
#endif

    return RecyclerNew(recycler, JavascriptGenerator, generatorType, heapArgs, scriptFunction);
}